

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     Combine<duckdb::ArgMinMaxState<duckdb::hugeint_t,long>,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  ArgMinMaxState<duckdb::hugeint_t,_long> *source_00;
  ArgMinMaxState<duckdb::hugeint_t,_long> *in_RCX;
  idx_t i;
  ArgMinMaxState<duckdb::hugeint_t,_long> **tdata;
  ArgMinMaxState<duckdb::hugeint_t,_long> **sdata;
  ArgMinMaxState<duckdb::hugeint_t,_long> *target_00;
  
  FlatVector::GetData<duckdb::ArgMinMaxState<duckdb::hugeint_t,long>const*>((Vector *)0x893f32);
  source_00 = (ArgMinMaxState<duckdb::hugeint_t,_long> *)
              FlatVector::GetData<duckdb::ArgMinMaxState<duckdb::hugeint_t,long>*>
                        ((Vector *)0x893f41);
  for (target_00 = (ArgMinMaxState<duckdb::hugeint_t,_long> *)0x0; target_00 < in_RCX;
      target_00 = (ArgMinMaxState<duckdb::hugeint_t,_long> *)
                  &(target_00->super_ArgMinMaxStateBase).arg_null) {
    ArgMinMaxBase<duckdb::LessThan,true>::
    Combine<duckdb::ArgMinMaxState<duckdb::hugeint_t,long>,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
              (source_00,target_00,(AggregateInputData *)0x893f7d);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}